

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dbfc4::CpuImmediateTest_sbc_carry_but_no_overflow_Test::
~CpuImmediateTest_sbc_carry_but_no_overflow_Test
          (CpuImmediateTest_sbc_carry_but_no_overflow_Test *this)

{
  CpuImmediateTest_sbc_carry_but_no_overflow_Test *this_local;
  
  ~CpuImmediateTest_sbc_carry_but_no_overflow_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, sbc_carry_but_no_overflow) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x20;
    memory_content = 0x30;

    run_instruction(SBC_IMM);
}